

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseSkeletonElement
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,int iTime)

{
  pointer *ppMVar1;
  uint uVar2;
  pointer pBVar3;
  iterator __position;
  pointer pMVar4;
  bool bVar5;
  pointer m;
  Assimp *pAVar6;
  Logger *this_00;
  undefined1 uVar7;
  undefined1 uVar8;
  ulong uVar9;
  ulong uVar10;
  Assimp *pAVar11;
  aiVector3D vRot;
  aiVector3D vPos;
  aiMatrix4x4t<float> temp;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e4;
  float local_dc;
  pointer local_d8;
  MatrixKey local_d0;
  
  local_e4 = 0;
  local_dc = 0.0;
  local_f0 = 0;
  local_e8 = 0.0;
  pAVar6 = (Assimp *)szCurrent;
  while( true ) {
    uVar10 = (ulong)(byte)*pAVar6;
    if (0x20 < uVar10) break;
    if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
        bVar5 = false;
        goto LAB_0062679c;
      }
      break;
    }
    pAVar6 = pAVar6 + 1;
  }
  bVar5 = true;
LAB_0062679c:
  if (bVar5) {
    uVar9 = 0;
    if (0xf5 < (byte)((char)*pAVar6 - 0x3aU)) {
      do {
        uVar2 = (uint)(byte)((char)uVar10 - 0x30) + (int)uVar9 * 10;
        uVar9 = (ulong)uVar2;
        pAVar11 = pAVar6 + 1;
        uVar10 = (ulong)(byte)*pAVar11;
        pAVar6 = pAVar6 + 1;
      } while (0xf5 < (byte)((char)*pAVar11 - 0x3aU));
      uVar9 = (ulong)uVar2;
    }
  }
  else {
    uVar9 = 0;
    pAVar6 = (Assimp *)szCurrent;
  }
  if (bVar5) {
    pBVar3 = (this->asBones).
             super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((long)(this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 4) *
             -0x71c71c71c71c71c7;
    if (uVar10 < uVar9 || uVar10 - uVar9 == 0) {
      LogErrorNoThrow(this,"Bone index in skeleton section is out of range");
      while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
        pAVar6 = pAVar6 + 1;
      }
      for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1) {
      }
    }
    else {
      memset(&local_d0,0,0xa0);
      local_d0.matrix.a1 = 1.0;
      local_d0.matrix.a2 = 0.0;
      local_d0.matrix.a3 = 0.0;
      local_d0.matrix.a4 = 0.0;
      local_d0.matrix.b1 = 0.0;
      local_d0.matrix.b2 = 1.0;
      local_d0.matrix.b3 = 0.0;
      local_d0.matrix.b4 = 0.0;
      local_d0.matrix.c1 = 0.0;
      local_d0.matrix.c2 = 0.0;
      local_d0.matrix.c3 = 1.0;
      local_d0.matrix.c4 = 0.0;
      local_d0.matrix.d1 = 0.0;
      local_d0.matrix.d2 = 0.0;
      local_d0.matrix.d3 = 0.0;
      uVar8 = 0;
      local_d0.matrix.d4 = 1.0;
      local_d0.matrixAbsolute.a1 = 1.0;
      local_d0.matrixAbsolute.a2 = 0.0;
      local_d0.matrixAbsolute.a3 = 0.0;
      local_d0.matrixAbsolute.a4 = 0.0;
      local_d0.matrixAbsolute.b1 = 0.0;
      local_d0.matrixAbsolute.b2 = 1.0;
      local_d0.matrixAbsolute.b3 = 0.0;
      local_d0.matrixAbsolute.b4 = 0.0;
      local_d0.matrixAbsolute.c1 = 0.0;
      local_d0.matrixAbsolute.c2 = 0.0;
      local_d0.matrixAbsolute.c3 = 1.0;
      local_d0.matrixAbsolute.c4 = 0.0;
      local_d0.matrixAbsolute.d1 = 0.0;
      local_d0.matrixAbsolute.d2 = 0.0;
      local_d0.matrixAbsolute.d3 = 0.0;
      local_d0.matrixAbsolute.d4 = 1.0;
      local_d0.vPos.x = 0.0;
      local_d0.vPos.y = 0.0;
      local_d0.vPos.z = 0.0;
      local_d0.vRot.x = 0.0;
      local_d0.vRot.y = 0.0;
      local_d0.vRot.z = 0.0;
      __position._M_current =
           *(pointer *)
            ((long)&pBVar3[uVar9].sAnim.asKeys.
                    super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
            + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&pBVar3[uVar9].sAnim.asKeys.
                   super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
           + 0x10)) {
        std::
        vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
        ::_M_realloc_insert<Assimp::SMD::Bone::Animation::MatrixKey>
                  (&pBVar3[uVar9].sAnim.asKeys,__position,&local_d0);
      }
      else {
        memcpy(__position._M_current,&local_d0,0xa0);
        ppMVar1 = (pointer *)
                  ((long)&pBVar3[uVar9].sAnim.asKeys.
                          super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                  + 8);
        *ppMVar1 = *ppMVar1 + 1;
      }
      pMVar4 = *(pointer *)
                ((long)&pBVar3[uVar9].sAnim.asKeys.
                        super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                + 8);
      local_d8 = pMVar4 + -1;
      pMVar4[-1].dTime = (double)iTime;
      for (pAVar11 = pAVar6; uVar10 = (ulong)(byte)*pAVar11, uVar10 < 0x21; pAVar11 = pAVar11 + 1) {
        if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
          uVar7 = true;
          uVar8 = 1;
          if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
            bVar5 = false;
            goto LAB_00626991;
          }
          break;
        }
      }
      uVar7 = uVar8;
      bVar5 = true;
LAB_00626991:
      if (bVar5) {
        pAVar6 = (Assimp *)
                 fast_atoreal_move<float>(pAVar11,(char *)&local_e4,(float *)0x1,(bool)uVar7);
        for (pAVar11 = pAVar6; uVar10 = (ulong)(byte)*pAVar11, uVar10 < 0x21; pAVar11 = pAVar11 + 1)
        {
          if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
            uVar8 = true;
            uVar7 = 1;
            if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
              bVar5 = false;
              goto LAB_00626a18;
            }
            break;
          }
        }
        uVar8 = uVar7;
        bVar5 = true;
LAB_00626a18:
        if (bVar5) {
          pAVar6 = (Assimp *)
                   fast_atoreal_move<float>
                             (pAVar11,(char *)((long)&local_e4 + 4),(float *)0x1,(bool)uVar8);
          for (pAVar11 = pAVar6; uVar10 = (ulong)(byte)*pAVar11, uVar10 < 0x21;
              pAVar11 = pAVar11 + 1) {
            if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
              uVar7 = true;
              uVar8 = 1;
              if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
                bVar5 = false;
                goto LAB_00626a9f;
              }
              break;
            }
          }
          uVar7 = uVar8;
          bVar5 = true;
LAB_00626a9f:
          if (bVar5) {
            pAVar6 = (Assimp *)
                     fast_atoreal_move<float>(pAVar11,(char *)&local_dc,(float *)0x1,(bool)uVar7);
            for (pAVar11 = pAVar6; uVar10 = (ulong)(byte)*pAVar11, uVar10 < 0x21;
                pAVar11 = pAVar11 + 1) {
              if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
                uVar8 = true;
                uVar7 = 1;
                if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
                  bVar5 = false;
                  goto LAB_00626b2d;
                }
                break;
              }
            }
            uVar8 = uVar7;
            bVar5 = true;
LAB_00626b2d:
            if (bVar5) {
              pAVar6 = (Assimp *)
                       fast_atoreal_move<float>(pAVar11,(char *)&local_f0,(float *)0x1,(bool)uVar8);
              for (pAVar11 = pAVar6; uVar10 = (ulong)(byte)*pAVar11, uVar10 < 0x21;
                  pAVar11 = pAVar11 + 1) {
                if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
                  uVar7 = true;
                  uVar8 = 1;
                  if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
                    bVar5 = false;
                    goto LAB_00626bbb;
                  }
                  break;
                }
              }
              uVar7 = uVar8;
              bVar5 = true;
LAB_00626bbb:
              if (bVar5) {
                pAVar6 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar11,(char *)((long)&local_f0 + 4),(float *)0x1,(bool)uVar7);
                for (pAVar11 = pAVar6; uVar10 = (ulong)(byte)*pAVar11, uVar10 < 0x21;
                    pAVar11 = pAVar11 + 1) {
                  if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
                    uVar8 = true;
                    uVar7 = 1;
                    if ((0x3401UL >> (uVar10 & 0x3f) & 1) != 0) {
                      bVar5 = false;
                      goto LAB_00626c49;
                    }
                    break;
                  }
                }
                uVar8 = uVar7;
                bVar5 = true;
LAB_00626c49:
                if (bVar5) {
                  pAVar6 = (Assimp *)
                           fast_atoreal_move<float>
                                     (pAVar11,(char *)&local_e8,(float *)0x1,(bool)uVar8);
                  m = local_d8;
                  aiMatrix4x4t<float>::FromEulerAnglesXYZ
                            (&local_d8->matrix,(float)local_f0,local_f0._4_4_,local_e8);
                  local_d0.matrix.a1 = 1.0;
                  local_d0.matrix.a2 = 0.0;
                  local_d0.matrix.a3 = 0.0;
                  local_d0.matrix.a4 = (float)local_e4;
                  local_d0.matrix.b1 = 0.0;
                  local_d0.matrix.b2 = 1.0;
                  local_d0.matrix._24_8_ = local_e4 & 0xffffffff00000000;
                  local_d0.matrix.c1 = 0.0;
                  local_d0.matrix.c2 = 0.0;
                  local_d0.matrix.c3 = 1.0;
                  local_d0.matrix.c4 = local_dc;
                  local_d0.matrix.d1 = 0.0;
                  local_d0.matrix.d2 = 0.0;
                  local_d0.matrix.d3 = 0.0;
                  local_d0.matrix.d4 = 1.0;
                  aiMatrix4x4t<float>::operator*=(&local_d0.matrix,&m->matrix);
                  (m->matrix).d1 = local_d0.matrix.d1;
                  (m->matrix).d2 = local_d0.matrix.d2;
                  (m->matrix).d3 = local_d0.matrix.d3;
                  (m->matrix).d4 = local_d0.matrix.d4;
                  (m->matrix).c1 = local_d0.matrix.c1;
                  (m->matrix).c2 = local_d0.matrix.c2;
                  (m->matrix).c3 = local_d0.matrix.c3;
                  (m->matrix).c4 = local_d0.matrix.c4;
                  (m->matrix).b1 = local_d0.matrix.b1;
                  (m->matrix).b2 = local_d0.matrix.b2;
                  (m->matrix).b3 = local_d0.matrix.b3;
                  (m->matrix).b4 = local_d0.matrix.b4;
                  (m->matrix).a1 = local_d0.matrix.a1;
                  (m->matrix).a2 = local_d0.matrix.a2;
                  (m->matrix).a3 = local_d0.matrix.a3;
                  (m->matrix).a4 = local_d0.matrix.a4;
                  pMVar4[-1].vPos.z = local_dc;
                  pMVar4[-1].vPos.x = (float)local_e4;
                  pMVar4[-1].vPos.y = (float)local_e4._4_4_;
                  pMVar4[-1].vRot.x = (float)local_f0;
                  pMVar4[-1].vRot.y = local_f0._4_4_;
                  pMVar4[-1].vRot.z = local_e8;
                  while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
                    pAVar6 = pAVar6 + 1;
                  }
                  for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1)
                  {
                  }
                }
                else {
                  LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.z");
                  while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
                    pAVar6 = pAVar6 + 1;
                  }
                  for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1)
                  {
                  }
                }
              }
              else {
                LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.y");
                while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
                  pAVar6 = pAVar6 + 1;
                }
                for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1) {
                }
              }
            }
            else {
              LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.rot.x");
              while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
                pAVar6 = pAVar6 + 1;
              }
              for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1) {
              }
            }
          }
          else {
            LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.z");
            while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
              pAVar6 = pAVar6 + 1;
            }
            for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1) {
            }
          }
        }
        else {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.y");
          while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
            pAVar6 = pAVar6 + 1;
          }
          for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1) {
          }
        }
      }
      else {
        LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone.pos.x");
        while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
          pAVar6 = pAVar6 + 1;
        }
        for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1) {
        }
      }
    }
  }
  else {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"Unexpected EOF/EOL while parsing bone index");
    while ((0xd < (byte)*pAVar6 || ((0x2401U >> ((byte)*pAVar6 & 0x1f) & 1) == 0))) {
      pAVar6 = pAVar6 + 1;
    }
    for (; (*pAVar6 == (Assimp)0xd || (*pAVar6 == (Assimp)0xa)); pAVar6 = pAVar6 + 1) {
    }
  }
  this->iLineNumber = this->iLineNumber + 1;
  *szCurrentOut = (char *)pAVar6;
  return;
}

Assistant:

void SMDImporter::ParseSkeletonElement(const char* szCurrent, const char** szCurrentOut,int iTime) {
    aiVector3D vPos;
    aiVector3D vRot;

    unsigned int iBone  = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iBone)) {
        ASSIMP_LOG_ERROR("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    if (iBone >= asBones.size()) {
        LogErrorNoThrow("Bone index in skeleton section is out of range");
        SMDI_PARSE_RETURN;
    }
    SMD::Bone& bone = asBones[iBone];

    bone.sAnim.asKeys.push_back(SMD::Bone::Animation::MatrixKey());
    SMD::Bone::Animation::MatrixKey& key = bone.sAnim.asKeys.back();

    key.dTime = (double)iTime;
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.z");
        SMDI_PARSE_RETURN;
    }
    // build the transformation matrix of the key
    key.matrix.FromEulerAnglesXYZ(vRot.x,vRot.y,vRot.z); {
        aiMatrix4x4 mTemp;
        mTemp.a4 = vPos.x;
        mTemp.b4 = vPos.y;
        mTemp.c4 = vPos.z;
        key.matrix = mTemp * key.matrix;
    }
    key.vPos = vPos;
    key.vRot = vRot;
    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}